

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void acvf_opt(double *vec,int N,int method,double *par,int M)

{
  auto_fft_object obj;
  
  if (method == 1) {
    obj = auto_fft_init(N);
    autocovar_fft(obj,vec,par,M);
    free_auto(obj);
    return;
  }
  if (method == 0) {
    autocovar(vec,N,par,M);
    return;
  }
  puts("\n The code only accepts numerical values 0 and 1 ");
  puts("\n Method 0 : General Method ");
  puts("\n Method 1 : FFT ");
  return;
}

Assistant:

void acvf_opt(double* vec, int N, int method, double* par, int M) {
	//Method 0 : Regular Method. Slow for large input length.
	//Method 1 : FFT based Method. Use it if data length is large
	auto_fft_object obj;

	if (method == 0) {
		autocovar(vec, N, par, M);
	}
	else if (method == 1) {
		obj = auto_fft_init(N);
		autocovar_fft(obj, vec, par, M);
		free_auto(obj);
	}
	else {
		printf("\n The code only accepts numerical values 0 and 1 \n");
		printf("\n Method 0 : General Method \n");
		printf("\n Method 1 : FFT \n");

	}
}